

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::MaskInvertCase::init
          (MaskInvertCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  EVP_PKEY_CTX *ctx_00;
  GLint maxSampleMaskWords;
  int local_44;
  string local_40;
  
  iVar1 = (*((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  ctx_00 = (EVP_PKEY_CTX *)&local_44;
  local_44 = 0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x8e59);
  iVar2 = (this->super_DefaultFBOMultisampleCase).m_numSamples;
  iVar1 = iVar2 + -1;
  iVar2 = iVar2 + 0x1e;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  if (iVar2 >> 5 < local_44) {
    iVar1 = DefaultFBOMultisampleCase::init(&this->super_DefaultFBOMultisampleCase,ctx_00);
    return iVar1;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Test requires larger GL_MAX_SAMPLE_MASK_WORDS","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void MaskInvertCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// check the test is even possible

	GLint maxSampleMaskWords = 0;
	gl.getIntegerv(GL_MAX_SAMPLE_MASK_WORDS, &maxSampleMaskWords);
	if (getEffectiveSampleMaskWordCount(m_numSamples - 1) > maxSampleMaskWords)
		throw tcu::NotSupportedError("Test requires larger GL_MAX_SAMPLE_MASK_WORDS");

	// normal init
	DefaultFBOMultisampleCase::init();
}